

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

CCPrepare * gen_prepare_cc(CCPrepare *__return_storage_ptr__,DisasContext *s,int b,TCGv_i64 reg)

{
  MemOp MVar1;
  TCGContext *tcg_ctx_00;
  uint uVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  target_ulong tVar5;
  TCGCond TVar6;
  ulong uVar7;
  _Bool _Var8;
  _Bool _Var9;
  MemOp size;
  uintptr_t o_4;
  TCGContext *tcg_ctx;
  undefined4 local_64;
  undefined2 local_60;
  undefined8 local_58;
  TCGv_i64 pTStack_50;
  TCGv_i64 local_48;
  TCGv_i32 local_40;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = (uint)b >> 1 & 7;
  MVar1 = s->cc_op;
  uVar7 = (ulong)MVar1;
  size = MVar1 - MO_BESL;
  if (MO_64 < size) {
    switch(uVar2) {
    case 0:
      goto switchD_0053d014_caseD_0;
    case 1:
      goto code_r0x0053d1a1;
    case 2:
      goto switchD_0053d014_caseD_2;
    case 3:
      gen_compute_eflags(s);
      pTVar4 = tcg_ctx_00->cpu_cc_src;
      __return_storage_ptr__->cond = TCG_COND_NE;
      __return_storage_ptr__->reg = pTVar4;
      __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
      __return_storage_ptr__->imm = 0;
      __return_storage_ptr__->mask = 0x41;
      goto LAB_0053d272;
    case 4:
      goto switchD_0053d014_caseD_4;
    case 5:
      goto switchD_0053d014_caseD_5;
    case 6:
      gen_compute_eflags(s);
      if (tcg_ctx_00->cpu_cc_src == reg) {
        reg = s->tmp0;
      }
      tcg_gen_shri_i64_x86_64(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_src,4);
      tcg_gen_op3_x86_64(tcg_ctx_00,INDEX_op_xor_i64,(TCGArg)(reg + (long)&tcg_ctx_00->pool_cur),
                         (TCGArg)(reg + (long)&tcg_ctx_00->pool_cur),
                         (TCGArg)(tcg_ctx_00->cpu_cc_src + (long)tcg_ctx_00));
      __return_storage_ptr__->cond = TCG_COND_NE;
      __return_storage_ptr__->reg = reg;
      __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
      __return_storage_ptr__->imm = 0;
      __return_storage_ptr__->mask = 0x80;
      break;
    case 7:
      gen_compute_eflags(s);
      if (tcg_ctx_00->cpu_cc_src == reg) {
        reg = s->tmp0;
      }
      tcg_gen_shri_i64_x86_64(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_src,4);
      tcg_gen_op3_x86_64(tcg_ctx_00,INDEX_op_xor_i64,(TCGArg)(reg + (long)&tcg_ctx_00->pool_cur),
                         (TCGArg)(reg + (long)&tcg_ctx_00->pool_cur),
                         (TCGArg)(tcg_ctx_00->cpu_cc_src + (long)tcg_ctx_00));
      __return_storage_ptr__->cond = TCG_COND_NE;
      __return_storage_ptr__->reg = reg;
      __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
      __return_storage_ptr__->imm = 0;
      __return_storage_ptr__->mask = 0xc0;
    }
    __return_storage_ptr__->use_reg2 = false;
    __return_storage_ptr__->no_setcond = false;
    goto LAB_0053d6d2;
  }
  switch(uVar2) {
  case 0:
switchD_0053d014_caseD_0:
    if (MVar1 + ~MO_ALIGN_8 < 2) {
      local_64 = 0;
      local_60 = 0;
      _Var8 = false;
      tVar5 = 0xffffffffffffffff;
      pTVar4 = (TCGv_i64)0x0;
      TVar6 = TCG_COND_NEVER;
    }
    else if (MVar1 - (MO_ALIGN_4|MO_BESL|MO_16) < 2) {
      pTVar4 = tcg_ctx_00->cpu_cc_src2;
      TVar6 = TCG_COND_NE;
      tVar5 = 0xffffffffffffffff;
      _Var8 = true;
    }
    else {
      gen_compute_eflags(s);
      pTVar4 = tcg_ctx_00->cpu_cc_src;
      TVar6 = TCG_COND_NE;
      tVar5 = 0x800;
      _Var8 = false;
    }
    __return_storage_ptr__->cond = TVar6;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    __return_storage_ptr__->reg = pTVar4;
    __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->mask = tVar5;
    __return_storage_ptr__->use_reg2 = false;
    __return_storage_ptr__->no_setcond = _Var8;
    goto LAB_0053d576;
  case 2:
switchD_0053d014_caseD_2:
    if ((int)MVar1 < 0x2e) {
      if (MVar1 == MO_8) {
        gen_compute_eflags(s);
      }
      else if (MVar1 != MO_16) {
LAB_0053d3ff:
        pTVar4 = gen_ext_tl(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_dst,MVar1 & MO_64 ^ MO_32,false);
        goto LAB_0053d422;
      }
LAB_0053d53d:
      pTVar4 = tcg_ctx_00->cpu_cc_src;
      tVar5 = 0x40;
      TVar6 = TCG_COND_NE;
    }
    else {
      if (MVar1 - (MO_ALIGN_4|MO_BESL) < 3) goto LAB_0053d53d;
      if (MVar1 == (MO_ALIGN_8|MO_16)) {
        local_64 = 0;
        local_60 = 0;
        tVar5 = 0xffffffffffffffff;
        TVar6 = TCG_COND_ALWAYS;
        pTVar4 = (TCGv_i64)0x0;
      }
      else {
        if (MVar1 != (MO_ALIGN_8|MO_32)) goto LAB_0053d3ff;
        pTVar4 = tcg_ctx_00->cpu_cc_src;
LAB_0053d422:
        tVar5 = 0xffffffffffffffff;
        TVar6 = TCG_COND_EQ;
      }
    }
    __return_storage_ptr__->cond = TVar6;
    goto LAB_0053d558;
  case 3:
    if (s->tmp4 != s->cc_srcT) {
      tcg_gen_op2_x86_64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(s->tmp4 + (long)tcg_ctx_00),
                         (TCGArg)(s->cc_srcT + (long)tcg_ctx_00));
    }
    gen_ext_tl(tcg_ctx_00,s->tmp4,s->tmp4,size,false);
    pTVar3 = gen_ext_tl(tcg_ctx_00,s->tmp0,tcg_ctx_00->cpu_cc_src,size,false);
    pTVar4 = s->tmp4;
    __return_storage_ptr__->cond = TCG_COND_LEU;
    __return_storage_ptr__->reg = pTVar4;
    __return_storage_ptr__->reg2 = pTVar3;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->mask = 0xffffffffffffffff;
    __return_storage_ptr__->use_reg2 = true;
    __return_storage_ptr__->no_setcond = false;
    goto LAB_0053d6d2;
  case 4:
switchD_0053d014_caseD_4:
    if (MVar1 < (MO_ALIGN_8|MO_64)) {
      if ((0x1c00000000002U >> (uVar7 & 0x3f) & 1) == 0) {
        if ((0x6000000000000U >> (uVar7 & 0x3f) & 1) != 0) {
          local_64 = 0;
          local_60 = 0;
          tVar5 = 0xffffffffffffffff;
          TVar6 = TCG_COND_NEVER;
          pTVar4 = (TCGv_i64)0x0;
          goto LAB_0053d504;
        }
        if (uVar7 != 0) goto LAB_0053d4ca;
        gen_compute_eflags(s);
      }
      pTVar4 = tcg_ctx_00->cpu_cc_src;
      tVar5 = 0x80;
      TVar6 = TCG_COND_NE;
    }
    else {
LAB_0053d4ca:
      pTVar4 = gen_ext_tl(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_dst,MVar1 & MO_64 ^ MO_32,true);
      tVar5 = 0xffffffffffffffff;
      TVar6 = TCG_COND_LT;
    }
LAB_0053d504:
    __return_storage_ptr__->cond = TVar6;
LAB_0053d558:
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    __return_storage_ptr__->reg = pTVar4;
    __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->mask = tVar5;
    __return_storage_ptr__->use_reg2 = false;
    __return_storage_ptr__->no_setcond = false;
LAB_0053d576:
    *(undefined4 *)&__return_storage_ptr__->field_0x2a = local_64;
    goto LAB_0053d6ce;
  case 5:
switchD_0053d014_caseD_5:
    gen_compute_eflags(s);
    pTVar4 = tcg_ctx_00->cpu_cc_src;
    __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->cond = TCG_COND_NE;
    __return_storage_ptr__->reg = pTVar4;
    __return_storage_ptr__->mask = 4;
LAB_0053d272:
    __return_storage_ptr__->use_reg2 = false;
    __return_storage_ptr__->no_setcond = false;
    goto LAB_0053d6d2;
  case 6:
    TVar6 = TCG_COND_LT;
    goto LAB_0053d282;
  case 7:
    TVar6 = TCG_COND_LE;
LAB_0053d282:
    if (s->tmp4 != s->cc_srcT) {
      tcg_gen_op2_x86_64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(s->tmp4 + (long)tcg_ctx_00),
                         (TCGArg)(s->cc_srcT + (long)tcg_ctx_00));
    }
    gen_ext_tl(tcg_ctx_00,s->tmp4,s->tmp4,size,true);
    pTVar3 = gen_ext_tl(tcg_ctx_00,s->tmp0,tcg_ctx_00->cpu_cc_src,size,true);
    pTVar4 = s->tmp4;
    __return_storage_ptr__->cond = TVar6;
    __return_storage_ptr__->reg = pTVar4;
    __return_storage_ptr__->reg2 = pTVar3;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->mask = 0xffffffffffffffff;
    __return_storage_ptr__->use_reg2 = true;
    __return_storage_ptr__->no_setcond = false;
    goto LAB_0053d6d2;
  }
code_r0x0053d1a1:
  switch(MVar1) {
  case MO_16:
  case MO_ALIGN_4|MO_LESL:
  case MO_ALIGN_4|MO_SSIZE:
  case MO_ALIGN_4|MO_BE:
  case MO_ALIGN_4|MO_BEUW:
    reg = tcg_ctx_00->cpu_cc_src;
    tVar5 = 1;
    goto LAB_0053d695;
  case MO_32:
  case MO_64:
  case MO_ASHIFT:
  case MO_LESW:
    reg = tcg_ctx_00->cpu_cc_src;
    tVar5 = 0xffffffffffffffff;
    goto LAB_0053d695;
  case MO_LESL:
  case MO_SSIZE:
  case MO_BE:
  case MO_BEUW:
    _Var8 = false;
    pTVar4 = gen_ext_tl(tcg_ctx_00,s->tmp0,tcg_ctx_00->cpu_cc_src,MVar1 - MO_LESL,false);
    reg = gen_ext_tl(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_dst,MVar1 - MO_LESL,false);
    TVar6 = TCG_COND_LTU;
    _Var9 = true;
    tVar5 = 0xffffffffffffffff;
    break;
  default:
    gen_update_cc_op(s);
    local_58 = (TCGTemp *)(tcg_ctx_00->cpu_cc_dst + (long)tcg_ctx_00);
    pTStack_50 = tcg_ctx_00->cpu_cc_src + (long)tcg_ctx_00;
    local_48 = tcg_ctx_00->cpu_cc_src2 + (long)tcg_ctx_00;
    local_40 = tcg_ctx_00->cpu_cc_op + (long)tcg_ctx_00;
    tcg_gen_callN_x86_64
              (tcg_ctx_00,helper_cc_compute_c_x86_64,(TCGTemp *)(reg + (long)&tcg_ctx_00->pool_cur),
               4,(TCGTemp **)&local_58);
    goto LAB_0053d1b8;
  case MO_BESL:
  case MO_BESL|MO_16:
  case MO_ALIGN_2:
  case MO_ALIGN_2|MO_16:
    pTVar4 = gen_ext_tl(tcg_ctx_00,s->tmp0,tcg_ctx_00->cpu_cc_src,size,false);
    if (pTVar4 == tcg_ctx_00->cpu_cc_src) {
      reg = s->tmp0;
    }
    if (reg != s->cc_srcT) {
      tcg_gen_op2_x86_64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(reg + (long)&tcg_ctx_00->pool_cur),
                         (TCGArg)(s->cc_srcT + (long)tcg_ctx_00));
    }
    _Var8 = false;
    gen_ext_tl(tcg_ctx_00,reg,reg,size,false);
    TVar6 = TCG_COND_LTU;
    _Var9 = true;
    tVar5 = 0xffffffffffffffff;
    break;
  case MO_ALIGN_2|MO_LESL:
  case MO_ALIGN_2|MO_SSIZE:
  case MO_ALIGN_2|MO_BE:
  case MO_ALIGN_2|MO_BEUW:
  case MO_ALIGN_8|MO_16:
  case MO_ALIGN_8|MO_32:
    local_58 = (TCGTemp *)0x0;
    _Var9 = false;
    tVar5 = 0xffffffffffffffff;
    _Var8 = false;
    pTVar4 = (TCGv_i64)0x0;
    reg = (TCGv_i64)0x0;
    TVar6 = TCG_COND_NEVER;
    break;
  case MO_ALIGN_2|MO_BEUL:
  case MO_ALIGN_2|MO_BEQ:
  case MO_ALIGN_2|MO_BE|MO_ASHIFT:
  case MO_ALIGN_2|MO_BESW:
  case MO_ALIGN_2|MO_BESL:
  case MO_ALIGN_2|MO_BESL|MO_16:
  case MO_ALIGN_4:
  case MO_ALIGN_4|MO_16:
    reg = tcg_ctx_00->cpu_cc_src;
    goto LAB_0053d1b8;
  case MO_ALIGN_4|MO_32:
  case MO_ALIGN_4|MO_64:
  case MO_ALIGN_4|MO_ASHIFT:
  case MO_ALIGN_4|MO_LESW:
    reg = tcg_ctx_00->cpu_cc_src;
    tVar5 = 1L << ((char)(8 << ((char)MVar1 - 0x22U & 0x1f)) - 1U & 0x3f);
LAB_0053d695:
    TVar6 = TCG_COND_NE;
LAB_0053d698:
    _Var8 = false;
LAB_0053d69b:
    _Var9 = false;
    pTVar4 = (TCGv_i64)0x0;
    break;
  case MO_ALIGN_4|MO_BEUL:
  case MO_ALIGN_4|MO_BEQ:
  case MO_ALIGN_4|MO_BE|MO_ASHIFT:
  case MO_ALIGN_4|MO_BESW:
    reg = gen_ext_tl(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_src,MVar1 - (MO_ALIGN_4|MO_BEUL),false);
    TVar6 = TCG_COND_EQ;
    tVar5 = 0xffffffffffffffff;
    goto LAB_0053d698;
  case MO_ALIGN_4|MO_BESL:
  case MO_ALIGN_8:
    reg = tcg_ctx_00->cpu_cc_dst;
LAB_0053d1b8:
    TVar6 = TCG_COND_NE;
    _Var8 = true;
    tVar5 = 0xffffffffffffffff;
    goto LAB_0053d69b;
  }
  __return_storage_ptr__->cond = TVar6;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
  __return_storage_ptr__->reg = reg;
  __return_storage_ptr__->reg2 = pTVar4;
  __return_storage_ptr__->imm = 0;
  __return_storage_ptr__->mask = tVar5;
  __return_storage_ptr__->use_reg2 = _Var9;
  __return_storage_ptr__->no_setcond = _Var8;
  *(undefined4 *)&__return_storage_ptr__->field_0x2a = (undefined4)local_58;
  local_60 = local_58._4_2_;
LAB_0053d6ce:
  *(undefined2 *)&__return_storage_ptr__->field_0x2e = local_60;
LAB_0053d6d2:
  if ((b & 1U) != 0) {
    *(undefined1 *)&__return_storage_ptr__->cond =
         (char)__return_storage_ptr__->cond ^ TCG_COND_ALWAYS;
  }
  return __return_storage_ptr__;
}

Assistant:

static CCPrepare gen_prepare_cc(DisasContext *s, int b, TCGv reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int inv, jcc_op, cond;
    MemOp size;
    CCPrepare cc;
    TCGv t0;

    inv = b & 1;
    jcc_op = (b >> 1) & 7;

    switch (s->cc_op) {
    case CC_OP_SUBB:
    case CC_OP_SUBW:
    case CC_OP_SUBL:
    case CC_OP_SUBQ:
        /* We optimize relational operators for the cmp/jcc case.  */
        size = s->cc_op - CC_OP_SUBB;
        switch (jcc_op) {
        case JCC_BE:
            tcg_gen_mov_tl(tcg_ctx, s->tmp4, s->cc_srcT);
            gen_extu(tcg_ctx, size, s->tmp4);
            t0 = gen_ext_tl(tcg_ctx, s->tmp0, tcg_ctx->cpu_cc_src, size, false);
            cc = (CCPrepare) { .cond = TCG_COND_LEU, .reg = s->tmp4,
                               .reg2 = t0, .mask = -1, .use_reg2 = true };
            break;

        case JCC_L:
            cond = TCG_COND_LT;
            goto fast_jcc_l;
        case JCC_LE:
            cond = TCG_COND_LE;
        fast_jcc_l:
            tcg_gen_mov_tl(tcg_ctx, s->tmp4, s->cc_srcT);
            gen_exts(tcg_ctx, size, s->tmp4);
            t0 = gen_ext_tl(tcg_ctx, s->tmp0, tcg_ctx->cpu_cc_src, size, true);
            cc = (CCPrepare) { .cond = cond, .reg = s->tmp4,
                               .reg2 = t0, .mask = -1, .use_reg2 = true };
            break;

        default:
            goto slow_jcc;
        }
        break;

    default:
    slow_jcc:
        /* This actually generates good code for JC, JZ and JS.  */
        switch (jcc_op) {
        case JCC_O:
            cc = gen_prepare_eflags_o(s, reg);
            break;
        case JCC_B:
            cc = gen_prepare_eflags_c(s, reg);
            break;
        case JCC_Z:
            cc = gen_prepare_eflags_z(s, reg);
            break;
        case JCC_BE:
            gen_compute_eflags(s);
            cc = (CCPrepare) { .cond = TCG_COND_NE, .reg = tcg_ctx->cpu_cc_src,
                               .mask = CC_Z | CC_C };
            break;
        case JCC_S:
            cc = gen_prepare_eflags_s(s, reg);
            break;
        case JCC_P:
            cc = gen_prepare_eflags_p(s, reg);
            break;
        case JCC_L:
            gen_compute_eflags(s);
            if (reg == tcg_ctx->cpu_cc_src) {
                reg = s->tmp0;
            }
            tcg_gen_shri_tl(tcg_ctx, reg, tcg_ctx->cpu_cc_src, 4); /* CC_O -> CC_S */
            tcg_gen_xor_tl(tcg_ctx, reg, reg, tcg_ctx->cpu_cc_src);
            cc = (CCPrepare) { .cond = TCG_COND_NE, .reg = reg,
                               .mask = CC_S };
            break;
        default:
        case JCC_LE:
            gen_compute_eflags(s);
            if (reg == tcg_ctx->cpu_cc_src) {
                reg = s->tmp0;
            }
            tcg_gen_shri_tl(tcg_ctx, reg, tcg_ctx->cpu_cc_src, 4); /* CC_O -> CC_S */
            tcg_gen_xor_tl(tcg_ctx, reg, reg, tcg_ctx->cpu_cc_src);
            cc = (CCPrepare) { .cond = TCG_COND_NE, .reg = reg,
                               .mask = CC_S | CC_Z };
            break;
        }
        break;
    }

    if (inv) {
        cc.cond = tcg_invert_cond(cc.cond);
    }
    return cc;
}